

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermediateParser.cpp
# Opt level: O3

unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> __thiscall
cs222::IntermediateParser::next(IntermediateParser *this)

{
  string *__args_2;
  size_t *__args_1;
  bitset<6UL> *flags;
  size_type *psVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  ulong uVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  Format FVar8;
  istream *piVar9;
  int *piVar10;
  ulong addr;
  const_iterator cVar11;
  long lVar12;
  Instruction *this_00;
  undefined8 uVar13;
  char *pcVar14;
  char *pcVar15;
  Parser *in_RSI;
  pointer this_01;
  _Alloc_hider _Var16;
  string token;
  string operation;
  string lookahead;
  Operand_pair temp;
  string label;
  string comment;
  smatch match;
  string operandsToken;
  Operand_pair operands;
  stringstream sstream;
  ios_base local_138 [264];
  
  piVar9 = in_RSI->inputStream;
  __args_2 = &in_RSI->line;
  cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar9 + -0x18) + (char)piVar9);
  piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     (piVar9,(string *)__args_2,cVar5);
  if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
LAB_00134190:
    (this->super_Parser)._vptr_Parser = (_func_int **)0x0;
    return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
           )(__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
             )this;
  }
  in_RSI->lineNumber = in_RSI->lineNumber + 1;
  (in_RSI->flags).super__Base_bitset<1UL>._M_w = 0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&operands,"^\\s*$",0x10);
  __s._M_current = (in_RSI->line)._M_dataplus._M_p;
  _sstream = (pointer)0x0;
  bVar6 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + (in_RSI->line)._M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&sstream,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&operands,0
                    );
  if (_sstream != (pointer)0x0) {
    operator_delete(_sstream,-(long)_sstream);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&operands);
  if ((bVar6) ||
     (((byte)in_RSI->inputStream[*(long *)(*(long *)in_RSI->inputStream + -0x18) + 0x20] & 5) != 0))
  goto LAB_00134190;
  std::__cxx11::stringstream::stringstream((stringstream *)&sstream,(string *)__args_2,_S_out|_S_in)
  ;
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  Parser::advanceToken(&sstream,&token);
  Parser::advanceToken(&sstream,&token);
  _Var3 = token._M_dataplus;
  if (*token._M_dataplus._M_p == '.') {
    (**in_RSI->_vptr_Parser)(this);
    goto LAB_00134a07;
  }
  piVar10 = __errno_location();
  iVar7 = *piVar10;
  *piVar10 = 0;
  addr = strtoul(_Var3._M_p,(char **)&operands,0x10);
  if ((pointer)operands.first._0_8_ == _Var3._M_p) {
    uVar13 = std::__throw_invalid_argument("stoul");
    std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
              ((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != &comment.field_2) {
      operator_delete(comment._M_dataplus._M_p,
                      CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                               comment.field_2._M_local_buf[0]) + 1);
    }
    std::pair<cs222::Operand,_cs222::Operand>::~pair(&operands);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)operandsToken._M_dataplus._M_p != &operandsToken.field_2) {
      operator_delete(operandsToken._M_dataplus._M_p,
                      CONCAT71(operandsToken.field_2._M_allocated_capacity._1_7_,
                               operandsToken.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)operation._M_dataplus._M_p != &operation.field_2) {
      operator_delete(operation._M_dataplus._M_p,
                      CONCAT71(operation.field_2._M_allocated_capacity._1_7_,
                               operation.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)label._M_dataplus._M_p != &label.field_2) {
      operator_delete(label._M_dataplus._M_p,
                      CONCAT71(label.field_2._M_allocated_capacity._1_7_,
                               label.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)token._M_dataplus._M_p != &token.field_2) {
      operator_delete(token._M_dataplus._M_p,
                      CONCAT71(token.field_2._M_allocated_capacity._1_7_,
                               token.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&sstream);
    std::ios_base::~ios_base(local_138);
    _Unwind_Resume(uVar13);
  }
  if (*piVar10 == 0) {
LAB_00134263:
    *piVar10 = iVar7;
  }
  else if (*piVar10 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_00134263;
  }
  Parser::advanceToken(&sstream,&token);
  label._M_dataplus._M_p = (pointer)&label.field_2;
  label._M_string_length = 0;
  label.field_2._M_local_buf[0] = '\0';
  operation._M_dataplus._M_p = (pointer)&operation.field_2;
  operation._M_string_length = 0;
  operation.field_2._M_local_buf[0] = '\0';
  operandsToken._M_dataplus._M_p = (pointer)&operandsToken.field_2;
  operandsToken._M_string_length = 0;
  operandsToken.field_2._M_local_buf[0] = '\0';
  std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>(&operands);
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  bVar6 = isDirective(&token);
  __args_1 = &in_RSI->lineNumber;
  if ((bVar6) || (bVar6 = isOperation(&token), bVar6)) {
LAB_0013438d:
    Parser::parseOperation(in_RSI,&token,&operation);
    bVar6 = isOperation(&operation);
    flags = &in_RSI->flags;
    if (bVar6) {
      cVar11 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)OpTable_abi_cxx11_,&operation);
      FVar8 = Operation::getValidFormat
                        ((Operation *)
                         ((long)cVar11.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
                                ._M_cur + 0x28));
      if ((FVar8 == FORMAT_1) ||
         (iVar7 = std::__cxx11::string::compare((char *)&operation), iVar7 == 0)) {
        Parser::advanceToken(&sstream,&token);
        std::__cxx11::string::_M_assign((string *)&comment);
        Parser::flushRestToToken(&sstream,&token);
        std::__cxx11::string::_M_append((char *)&comment,(ulong)token._M_dataplus._M_p);
        std::
        make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand&,cs222::Operand&,std::__cxx11::string&,std::__cxx11::string&,std::bitset<6ul>&>
                  ((unsigned_long *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,
                   __args_2,&label,(Operand *)&operation,&operands.first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &operands.second,&operandsToken,(bitset<6UL> *)&comment);
        Instruction::setAddress((Instruction *)(this->super_Parser)._vptr_Parser,addr);
        goto LAB_00134947;
      }
    }
    lookahead._M_dataplus._M_p = (pointer)&lookahead.field_2;
    lookahead._M_string_length = 0;
    lookahead.field_2._M_local_buf[0] = '\0';
    lVar12 = std::istream::tellg();
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)&temp,(ulong)__args_2);
      std::__cxx11::string::operator=((string *)&lookahead,(string *)&temp);
      if ((size_type *)temp.first._0_8_ != &temp.first.value._M_string_length) {
        operator_delete((void *)temp.first._0_8_,temp.first.value._M_string_length + 1);
      }
    }
    sVar4 = lookahead._M_string_length;
    _Var3._M_p = lookahead._M_dataplus._M_p;
    _Var16._M_p = lookahead._M_dataplus._M_p;
    if (0 < (long)lookahead._M_string_length >> 2) {
      _Var16._M_p = lookahead._M_dataplus._M_p + (lookahead._M_string_length & 0xfffffffffffffffc);
      lVar12 = ((long)lookahead._M_string_length >> 2) + 1;
      pcVar15 = lookahead._M_dataplus._M_p + 3;
      do {
        iVar7 = isspace((int)pcVar15[-3]);
        if (iVar7 == 0) {
          pcVar15 = pcVar15 + -3;
          goto LAB_0013462c;
        }
        iVar7 = isspace((int)pcVar15[-2]);
        if (iVar7 == 0) {
          pcVar15 = pcVar15 + -2;
          goto LAB_0013462c;
        }
        iVar7 = isspace((int)pcVar15[-1]);
        if (iVar7 == 0) {
          pcVar15 = pcVar15 + -1;
          goto LAB_0013462c;
        }
        iVar7 = isspace((int)*pcVar15);
        if (iVar7 == 0) goto LAB_0013462c;
        lVar12 = lVar12 + -1;
        pcVar15 = pcVar15 + 4;
      } while (1 < lVar12);
    }
    pcVar14 = _Var3._M_p + sVar4;
    lVar12 = (long)pcVar14 - (long)_Var16._M_p;
    if (lVar12 == 1) {
LAB_0013460a:
      iVar7 = isspace((int)*_Var16._M_p);
      pcVar15 = pcVar14;
      if (iVar7 == 0) {
        pcVar15 = _Var16._M_p;
      }
    }
    else if (lVar12 == 2) {
LAB_001345ef:
      iVar7 = isspace((int)*_Var16._M_p);
      pcVar15 = _Var16._M_p;
      if (iVar7 != 0) {
        _Var16._M_p = _Var16._M_p + 1;
        goto LAB_0013460a;
      }
    }
    else {
      pcVar15 = pcVar14;
      if ((lVar12 == 3) && (iVar7 = isspace((int)*_Var16._M_p), pcVar15 = _Var16._M_p, iVar7 != 0))
      {
        _Var16._M_p = _Var16._M_p + 1;
        goto LAB_001345ef;
      }
    }
LAB_0013462c:
    std::__cxx11::string::substr((ulong)&temp,(ulong)&lookahead);
    std::__cxx11::string::operator=((string *)&lookahead,(string *)&temp);
    psVar1 = &temp.first.value._M_string_length;
    if ((size_type *)temp.first._0_8_ != psVar1) {
      operator_delete((void *)temp.first._0_8_,temp.first.value._M_string_length + 1);
    }
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    match._M_begin._M_current = (char *)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&temp,
               "^\\=?C\'[A-Za-z0-9\\s]+\'",0x10);
    bVar6 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )lookahead._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(lookahead._M_dataplus._M_p + lookahead._M_string_length),&match,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&temp,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&temp);
    if (bVar6) {
      this_01 = match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x48) {
        this_01 = match.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
      }
      if (match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this_01 = match.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
      }
      std::__cxx11::sub_match::operator_cast_to_string((string_type *)&temp,(sub_match *)this_01);
      std::__cxx11::string::operator=((string *)&token,(string *)&temp);
      if ((size_type *)temp.first._0_8_ != psVar1) {
        operator_delete((void *)temp.first._0_8_,temp.first.value._M_string_length + 1);
      }
      std::istream::seekg((long)&sstream,
                          ((int)pcVar15 - (int)_Var3._M_p) + (int)token._M_string_length);
    }
    else {
      Parser::advanceToken(&sstream,&token);
    }
    std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>(&temp);
    bVar6 = Parser::parseOperands(in_RSI,&token,&temp);
    if (bVar6) {
      std::__cxx11::string::_M_assign((string *)&operandsToken);
      std::pair<cs222::Operand,_cs222::Operand>::operator=(&operands,&temp);
      bVar6 = isOperation(&operation);
      if (bVar6) {
        cVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)OpTable_abi_cxx11_,&operation);
        FVar8 = Operation::getValidFormat
                          ((Operation *)
                           ((long)cVar11.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
                                  ._M_cur + 0x28));
        if ((FVar8 == FORMAT_3_4) &&
           (uVar2 = (flags->super__Base_bitset<1UL>)._M_w, (uVar2 & 0x30) == 0)) {
          (flags->super__Base_bitset<1UL>)._M_w = uVar2 | 0x30;
        }
      }
      Parser::advanceToken(&sstream,&token);
    }
    std::__cxx11::string::_M_assign((string *)&comment);
    Parser::flushRestToToken(&sstream,&token);
    std::__cxx11::string::_M_append((char *)&comment,(ulong)token._M_dataplus._M_p);
    this_00 = (Instruction *)operator_new(0x140);
    Instruction::Instruction
              (this_00,__args_1,__args_2,&label,&operation,&operands.first,&operands.second,
               &operandsToken,&comment,flags);
    (this->super_Parser)._vptr_Parser = (_func_int **)this_00;
    Instruction::setAddress(this_00,addr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp.second.value._M_dataplus._M_p != &temp.second.value.field_2) {
      operator_delete(temp.second.value._M_dataplus._M_p,
                      temp.second.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp.first.value._M_dataplus._M_p != &temp.first.value.field_2) {
      operator_delete(temp.first.value._M_dataplus._M_p,
                      temp.first.value.field_2._M_allocated_capacity + 1);
    }
    if (match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lookahead._M_dataplus._M_p != &lookahead.field_2) {
      operator_delete(lookahead._M_dataplus._M_p,
                      CONCAT71(lookahead.field_2._M_allocated_capacity._1_7_,
                               lookahead.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&temp,(ulong)&token);
    bVar6 = isOperation((string *)&temp);
    if ((size_type *)temp.first._0_8_ != &temp.first.value._M_string_length) {
      operator_delete((void *)temp.first._0_8_,temp.first.value._M_string_length + 1);
    }
    if (bVar6) goto LAB_0013438d;
    iVar7 = std::__cxx11::string::compare((char *)&token);
    if (iVar7 != 0) {
      Parser::parseLabel(in_RSI,&token,&label);
      Parser::advanceToken(&sstream,&token);
      goto LAB_0013438d;
    }
    std::__cxx11::string::_M_assign((string *)&label);
    Parser::advanceToken(&sstream,&token);
    std::__cxx11::string::_M_assign((string *)&operation);
    Operand::Operand(&temp.first);
    Operand::Operand((Operand *)&lookahead);
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand,cs222::Operand,char_const(&)[1],char_const(&)[1],std::bitset<6ul>>
              ((unsigned_long *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,
               __args_2,&label,(Operand *)&operation,&temp.first,(char (*) [1])&lookahead,
               (char (*) [1])0x136783,(bitset<6UL> *)0x136783);
    if ((undefined1 *)lookahead._M_string_length != (undefined1 *)((long)&lookahead.field_2 + 8)) {
      operator_delete((void *)lookahead._M_string_length,lookahead.field_2._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp.first.value._M_dataplus._M_p != &temp.first.value.field_2) {
      operator_delete(temp.first.value._M_dataplus._M_p,
                      temp.first.value.field_2._M_allocated_capacity + 1);
    }
    Instruction::setAddress((Instruction *)(this->super_Parser)._vptr_Parser,addr);
  }
LAB_00134947:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)operands.second.value._M_dataplus._M_p != &operands.second.value.field_2) {
    operator_delete(operands.second.value._M_dataplus._M_p,
                    operands.second.value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)operands.first.value._M_dataplus._M_p != &operands.first.value.field_2) {
    operator_delete(operands.first.value._M_dataplus._M_p,
                    operands.first.value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)operandsToken._M_dataplus._M_p != &operandsToken.field_2) {
    operator_delete(operandsToken._M_dataplus._M_p,
                    CONCAT71(operandsToken.field_2._M_allocated_capacity._1_7_,
                             operandsToken.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)operation._M_dataplus._M_p != &operation.field_2) {
    operator_delete(operation._M_dataplus._M_p,
                    CONCAT71(operation.field_2._M_allocated_capacity._1_7_,
                             operation.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)label._M_dataplus._M_p != &label.field_2) {
    operator_delete(label._M_dataplus._M_p,
                    CONCAT71(label.field_2._M_allocated_capacity._1_7_,label.field_2._M_local_buf[0]
                            ) + 1);
  }
LAB_00134a07:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)token._M_dataplus._M_p != &token.field_2) {
    operator_delete(token._M_dataplus._M_p,
                    CONCAT71(token.field_2._M_allocated_capacity._1_7_,token.field_2._M_local_buf[0]
                            ) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstream);
  std::ios_base::~ios_base(local_138);
  return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>)
         (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Instruction> IntermediateParser::next() {

        if (std::getline(inputStream, line))
        {
            lineNumber += 1;
            flags.reset();

            // Stop on empty line
            if (std::regex_match(line, std::regex("^\\s*$")))
                return nullptr;
            // Reached end of stream?
            if (!inputStream)
            {
                return nullptr;
            }

            std::stringstream sstream(line);
            std::string token;

            advanceToken(sstream, token);// Skipping line number.

            advanceToken(sstream, token);// Expecting address.

            if (token[0] == '.') {// Skip comment lines.
                return this->next();
            }

            std::size_t address;
            address = std::stoul(token, nullptr, 16);

            advanceToken(sstream, token);

            std::string label;
            std::string operation;
            std::string operandsToken;
            Operand_pair operands;
            std::string comment;

            if (!(
                    isDirective(token) ||
                    isOperation(token) ||
                    isOperation(token.substr(1))))
            {
                if (token == "*") { // Literal found.
                    label = token;
                    advanceToken(sstream, token);
                    operation = token;
                    std::unique_ptr<Instruction> ptr = std::make_unique<Instruction>(
                            lineNumber, line, label, operation,
                            Operand(), Operand(), "", "", std::bitset<6>());

                    (*ptr).setAddress(address);

                    return ptr;
                } else {
                    parseLabel(token, label);
                    advanceToken(sstream, token);
                }
            }

            parseOperation(token, operation);

            if (isOperation(operation))
            {
                Instruction::Format fmt =
                        OpTable.find(operation)->second.getValidFormat();
                if (fmt == Instruction::FORMAT_1 || operation == "RSUB")
                {
                    advanceToken(sstream, token);
                    comment = token;
                    flushRestToToken(sstream, token);
                    comment += token;

                    std::unique_ptr<Instruction> ptr = std::make_unique<Instruction>(
                            lineNumber, line, label, operation,
                            operands.first, operands.second,
                            operandsToken, comment, flags);

                    (*ptr).setAddress(address);

                    return ptr;
                }
            }

            // Corner case: character constants
            // and literals can have spaces
            std::string lookahead;
            size_t lookahead_start = sstream.tellg();
            if (lookahead_start != -1)
            {
                lookahead = line.substr(lookahead_start);
            }
            size_t first_non_space = std::distance(
                    lookahead.begin(),
                    find_if_not(lookahead.begin(), lookahead.end(), isspace));
            lookahead = lookahead.substr(first_non_space);
            std::smatch match;
            if (std::regex_match(
                    lookahead,
                    match,
                    std::regex("^\\=?C'[A-Za-z0-9\\s]+'")))
            {
                token = match[0];
                sstream.seekg(
                        first_non_space + token.length(), std::ios_base::cur);
            }
            else
            {
                advanceToken(sstream, token);
            }

            Operand_pair temp;
            if (parseOperands(token, temp))
            {
                operandsToken = token;
                operands = temp;
                // SIC/XE Simple Addressing
                if (isOperation(operation))
                {
                    Instruction::Format fmt =
                            cs222::OpTable.find(operation)->second.getValidFormat();
                    if (fmt == Instruction::FORMAT_3_4 && !(
                            flags.test(Instruction::FLAG_INDIRECT) ||
                            flags.test(Instruction::FLAG_IMMEDIATE)))
                    {
                        flags.set(Instruction::FLAG_INDIRECT);
                        flags.set(Instruction::FLAG_IMMEDIATE);
                    }
                }
                advanceToken(sstream, token);
            }

            comment = token;
            flushRestToToken(sstream, token);
            comment += token;

            std::unique_ptr<Instruction> ptr = std::make_unique<Instruction>(
                    lineNumber, line, label, operation,
                    operands.first, operands.second,
                    operandsToken, comment, flags);

            (*ptr).setAddress(address);

            return ptr;
        }

        return nullptr;
    }